

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*>::
emplaceRealloc<slang::syntax::DelayedSequenceElementSyntax*>
          (SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax*> *this,pointer pos,
          DelayedSequenceElementSyntax **args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator ppDVar3;
  DelayedSequenceElementSyntax **__result;
  DelayedSequenceElementSyntax **ppDVar4;
  EVP_PKEY_CTX *ctx;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  DelayedSequenceElementSyntax **args_local;
  pointer pos_local;
  SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *this_local;
  
  sVar1 = *(size_type *)(this + 8);
  sVar2 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::max_size
                    ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::calculateGrowth
                       ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this,
                        *(long *)(this + 8) + 1);
  ppDVar3 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::begin
                      ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
  __result = (DelayedSequenceElementSyntax **)slang::detail::allocArray(capacity,8);
  ppDVar4 = __result + ((long)pos - (long)ppDVar3 >> 3);
  *ppDVar4 = *args;
  ppDVar3 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::end
                      ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
  if (pos == ppDVar3) {
    ppDVar3 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::DelayedSequenceElementSyntax**,slang::syntax::DelayedSequenceElementSyntax**>
              (ppDVar3,(DelayedSequenceElementSyntax **)ctx,__result);
  }
  else {
    ppDVar3 = SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::begin
                        ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::DelayedSequenceElementSyntax**,slang::syntax::DelayedSequenceElementSyntax**>
              (ppDVar3,pos,__result);
    ctx = (EVP_PKEY_CTX *)
          SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::end
                    ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this);
    std::
    uninitialized_move<slang::syntax::DelayedSequenceElementSyntax**,slang::syntax::DelayedSequenceElementSyntax**>
              (pos,(DelayedSequenceElementSyntax **)ctx,ppDVar4 + 1);
  }
  SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*>::cleanup
            ((SmallVectorBase<slang::syntax::DelayedSequenceElementSyntax_*> *)this,ctx);
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(size_type *)(this + 0x10) = capacity;
  *(DelayedSequenceElementSyntax ***)this = __result;
  return ppDVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}